

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

void __thiscall
cmExportCommand::StorePackageRegistryDir
          (cmExportCommand *this,string *package,char *content,char *hash)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_468;
  string local_448 [32];
  undefined1 local_428 [8];
  ostringstream e;
  undefined1 local_2b0 [8];
  cmGeneratedFileStream entry;
  allocator local_51;
  undefined1 local_50 [8];
  string fname;
  char *home;
  char *hash_local;
  char *content_local;
  string *package_local;
  cmExportCommand *this_local;
  
  pcVar2 = cmsys::SystemTools::GetEnv("HOME");
  if (pcVar2 != (char *)0x0) {
    fname.field_2._8_8_ = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar2,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_50);
    std::__cxx11::string::operator+=((string *)local_50,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_50,(string *)package);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
    std::__cxx11::string::operator+=((string *)local_50,"/");
    std::__cxx11::string::operator+=((string *)local_50,hash);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (!bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0,pcVar2,true);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)));
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)local_2b0,content);
        std::operator<<(poVar3,"\n");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        poVar3 = std::operator<<((ostream *)local_428,"Cannot create package registry file:\n");
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = std::operator<<(poVar3,(string *)local_50);
        poVar3 = std::operator<<(poVar3,"\n");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar3 = std::operator<<(poVar3,local_448);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string(local_448);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmExportCommand::StorePackageRegistryDir(std::string const& package,
                                              const char* content,
                                              const char* hash)
{
#if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK)
    {
    return;
    }
  std::string fname = dir;
  fname += "/cmake/packages/";
  fname += package;
#else
  const char* home = cmSystemTools::GetEnv("HOME");
  if(!home)
    {
    return;
    }
  std::string fname = home;
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#endif
  cmSystemTools::MakeDirectory(fname.c_str());
  fname += "/";
  fname += hash;
  if(!cmSystemTools::FileExists(fname.c_str()))
    {
    cmGeneratedFileStream entry(fname.c_str(), true);
    if(entry)
      {
      entry << content << "\n";
      }
    else
      {
      std::ostringstream e;
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      this->Makefile->IssueMessage(cmake::WARNING, e.str());
      }
    }
}